

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O1

void __thiscall helics::BaseTimeCoordinator::sendTimingInfo(BaseTimeCoordinator *this)

{
  pointer pDVar1;
  pointer pDVar2;
  ActionMessage tinfo;
  ActionMessage local_e0;
  
  ActionMessage::ActionMessage(&local_e0,cmd_timing_info);
  local_e0.source_id.gid = (this->mSourceId).gid;
  if (this->nonGranting == true) {
    local_e0.flags._0_1_ = (byte)local_e0.flags | 0x80;
  }
  if (this->delayedTiming == true) {
    local_e0.flags._1_1_ = local_e0.flags._1_1_ | 4;
  }
  local_e0.dest_handle.hid = 1;
  pDVar2 = (this->dependencies).dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (this->dependencies).dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pDVar2 != pDVar1) {
    do {
      if (pDVar2->dependent == true) {
        local_e0.dest_id.gid = (pDVar2->fedID).gid;
        if ((this->sendMessageFunction).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(this->sendMessageFunction)._M_invoker)((_Any_data *)&this->sendMessageFunction,&local_e0)
        ;
      }
      pDVar2 = pDVar2 + 1;
    } while (pDVar2 != pDVar1);
  }
  ActionMessage::~ActionMessage(&local_e0);
  return;
}

Assistant:

void BaseTimeCoordinator::sendTimingInfo()
{
    ActionMessage tinfo(CMD_TIMING_INFO);
    tinfo.source_id = mSourceId;
    if (nonGranting) {
        setActionFlag(tinfo, non_granting_flag);
    }
    if (delayedTiming) {
        setActionFlag(tinfo, delayed_timing_flag);
    }
    tinfo.setExtraData(TIME_COORDINATOR_VERSION);

    for (const auto& dep : dependencies) {
        if (dep.dependent) {
            tinfo.dest_id = dep.fedID;
            sendMessageFunction(tinfo);
        }
    }
}